

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb4Image.c
# Opt level: O3

void Llb_Nonlin4AddPartition(Llb_Mgr_t_conflict *p,int i,DdNode *bFunc)

{
  int iVar1;
  int iVar2;
  Llb_Prt_t *pLVar3;
  Vec_Int_t *pVVar4;
  int *piVar5;
  long lVar6;
  int iVar7;
  
  if (*(int *)((ulong)bFunc & 0xfffffffffffffffe) == 0x7fffffff) {
    __assert_fail("!Cudd_IsConstant(bFunc)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/bdd/llb/llb4Image.c"
                  ,0x219,"void Llb_Nonlin4AddPartition(Llb_Mgr_t *, int, DdNode *)");
  }
  pLVar3 = (Llb_Prt_t *)calloc(1,0x18);
  p->pParts[i] = pLVar3;
  pLVar3 = p->pParts[i];
  pLVar3->iPart = i;
  pLVar3->bFunc = bFunc;
  Cudd_Ref(bFunc);
  pVVar4 = (Vec_Int_t *)malloc(0x10);
  pVVar4->nCap = 0x10;
  pVVar4->nSize = 0;
  piVar5 = (int *)malloc(0x40);
  pVVar4->pArray = piVar5;
  p->pParts[i]->vVars = pVVar4;
  Extra_SupportArray(p->dd,bFunc,p->pSupp);
  iVar2 = p->nVars;
  if (iVar2 < 1) {
    iVar7 = 0;
  }
  else {
    lVar6 = 0;
    iVar7 = 0;
    do {
      iVar1 = p->pSupp[lVar6];
      if (iVar1 != 0) {
        if (p->vVars2Q->nSize <= lVar6) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                        ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        if (p->vVars2Q->pArray[lVar6] != 0) {
          Llb_Nonlin4AddPair(p,i,(int)lVar6);
          iVar2 = p->nVars;
        }
      }
      iVar7 = iVar7 + iVar1;
      lVar6 = lVar6 + 1;
    } while (lVar6 < iVar2);
  }
  if (iVar7 < p->nSuppMax) {
    iVar7 = p->nSuppMax;
  }
  p->nSuppMax = iVar7;
  return;
}

Assistant:

void Llb_Nonlin4AddPartition( Llb_Mgr_t * p, int i, DdNode * bFunc )
{
    int k, nSuppSize;
    assert( !Cudd_IsConstant(bFunc) );
//printf( "Creating init %d\n", i );
    // create partition
    p->pParts[i] = ABC_CALLOC( Llb_Prt_t, 1 );
    p->pParts[i]->iPart = i;
    p->pParts[i]->bFunc = bFunc;  Cudd_Ref( bFunc );
    p->pParts[i]->vVars = Vec_IntAlloc( 8 );
    // add support dependencies
    nSuppSize = 0;
    Extra_SupportArray( p->dd, bFunc, p->pSupp );
    for ( k = 0; k < p->nVars; k++ )
    {
        nSuppSize += p->pSupp[k];
        if ( p->pSupp[k] && Vec_IntEntry(p->vVars2Q, k) )
            Llb_Nonlin4AddPair( p, i, k );
    }
    p->nSuppMax = Abc_MaxInt( p->nSuppMax, nSuppSize ); 
}